

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.cpp
# Opt level: O0

void __thiscall
iu_Matcher_x_iutest_x_Member_Test::iu_Matcher_x_iutest_x_Member_Test
          (iu_Matcher_x_iutest_x_Member_Test *this)

{
  iu_Matcher_x_iutest_x_Member_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__iu_Matcher_x_iutest_x_Member_Test_0039f9d8;
  return;
}

Assistant:

IUTEST(Matcher, Member)
{
    X x(0, 1);
    ::std::map<int, X> m;
    for( int i=0; i < 10; ++i )
    {
        m.insert(::std::pair<int, X>(i, X(i, 100)));
    }
    IUTEST_EXPECT_THAT(m, Each(Key(Le(10))));
    IUTEST_EXPECT_THAT(m, Each(Pair(Le(10), Field(&X::b, Ge(0)))));
    IUTEST_EXPECT_THAT(x, Property(&X::GetA, 0));
    IUTEST_EXPECT_THAT(&x, Property(&X::GetA, 0));
}